

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  U32 UVar15;
  ulong uVar16;
  long *plVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  BYTE *pBVar21;
  ulong uVar22;
  long *plVar23;
  int iVar24;
  long *plVar25;
  U32 *hashTable;
  
  uVar9 = (ms->cParams).minMatch;
  pUVar5 = ms->hashTable;
  uVar8 = (ms->cParams).targetLength;
  uVar8 = uVar8 + (uVar8 == 0);
  pBVar6 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  pBVar21 = pBVar6 + uVar1;
  uVar2 = rep[1];
  plVar23 = (long *)((ulong)((int)src == (int)pBVar21) + (long)src);
  uVar20 = (int)plVar23 - (int)pBVar21;
  uVar22 = (ulong)uVar2;
  if (uVar20 < uVar2) {
    uVar22 = 0;
  }
  pInLimit = (BYTE *)((long)src + srcSize);
  plVar17 = (long *)((long)src + (srcSize - 8));
  uVar3 = *rep;
  uVar19 = 0;
  if (uVar3 <= uVar20) {
    uVar19 = uVar3;
  }
  iVar24 = (int)pBVar6;
  cVar7 = (char)(ms->cParams).hashLog;
  if (uVar9 == 5) {
    bVar11 = 0x40 - cVar7;
    do {
      do {
        uVar9 = (uint)uVar22;
        while( true ) {
          if (plVar17 <= plVar23) goto LAB_00373596;
          uVar13 = (ulong)(*plVar23 * -0x30e4432345000000) >> (bVar11 & 0x3f);
          uVar16 = (long)plVar23 - (long)pBVar6;
          uVar4 = pUVar5[uVar13];
          UVar15 = (U32)uVar16;
          pUVar5[uVar13] = UVar15;
          if ((uVar19 != 0) &&
             (*(int *)((long)plVar23 + -(ulong)uVar19 + 1) == *(int *)((long)plVar23 + 1))) {
            plVar25 = (long *)((long)plVar23 + 1);
            sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 5),
                                (BYTE *)((long)plVar23 + -(ulong)uVar19 + 5),pInLimit);
            ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,0,sVar10 + 1);
            goto LAB_0037323d;
          }
          if ((uVar1 < uVar4) && (piVar14 = (int *)(pBVar6 + uVar4), *piVar14 == (int)*plVar23))
          break;
          plVar23 = (long *)((long)plVar23 + ((long)plVar23 - (long)src >> 8) + (ulong)uVar8);
        }
        uVar9 = (int)plVar23 - (int)piVar14;
        sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 4),(BYTE *)(piVar14 + 1),pInLimit);
        for (lVar18 = 0;
            ((plVar25 = (long *)(lVar18 + (long)plVar23), pBVar21 < (BYTE *)((long)piVar14 + lVar18)
             && (src < plVar25)) &&
            (*(char *)((long)plVar23 + lVar18 + -1) == *(char *)((long)piVar14 + lVar18 + -1)));
            lVar18 = lVar18 + -1) {
        }
        sVar10 = sVar10 - lVar18;
        ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,uVar9 + 2,sVar10 + 1);
        uVar22 = (ulong)uVar19;
        uVar19 = uVar9;
LAB_0037323d:
        src = (void *)(sVar10 + 4 + (long)plVar25);
        plVar23 = (long *)src;
      } while (plVar17 < src);
      pUVar5[(ulong)(*(long *)(pBVar6 + (uVar16 & 0xffffffff) + 2) * -0x30e4432345000000) >>
             (bVar11 & 0x3f)] = UVar15 + 2;
      pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar11 & 0x3f)] =
           ((int)src + -2) - iVar24;
      uVar13 = (ulong)uVar19;
      for (; uVar16 = uVar13, uVar19 = (uint)uVar16, plVar23 = (long *)src, src <= plVar17;
          src = (void *)((long)src + sVar10 + 4)) {
        if (((int)uVar22 == 0) || ((int)*src != *(int *)((long)src - uVar22))) break;
        sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar22)),pInLimit);
        pUVar5[(ulong)(*src * -0x30e4432345000000) >> (bVar11 & 0x3f)] = (int)src - iVar24;
        ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
        uVar13 = uVar22;
        uVar22 = uVar16;
      }
    } while( true );
  }
  if (uVar9 == 6) {
    bVar11 = 0x40 - cVar7;
    do {
      do {
        uVar9 = (uint)uVar22;
        while( true ) {
          if (plVar17 <= plVar23) goto LAB_00373596;
          uVar13 = (ulong)(*plVar23 * -0x30e4432340650000) >> (bVar11 & 0x3f);
          uVar16 = (long)plVar23 - (long)pBVar6;
          uVar4 = pUVar5[uVar13];
          UVar15 = (U32)uVar16;
          pUVar5[uVar13] = UVar15;
          if ((uVar19 != 0) &&
             (*(int *)((long)plVar23 + -(ulong)uVar19 + 1) == *(int *)((long)plVar23 + 1))) {
            plVar25 = (long *)((long)plVar23 + 1);
            sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 5),
                                (BYTE *)((long)plVar23 + -(ulong)uVar19 + 5),pInLimit);
            ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,0,sVar10 + 1);
            goto LAB_00372fee;
          }
          if ((uVar1 < uVar4) && (piVar14 = (int *)(pBVar6 + uVar4), *piVar14 == (int)*plVar23))
          break;
          plVar23 = (long *)((long)plVar23 + ((long)plVar23 - (long)src >> 8) + (ulong)uVar8);
        }
        uVar9 = (int)plVar23 - (int)piVar14;
        sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 4),(BYTE *)(piVar14 + 1),pInLimit);
        for (lVar18 = 0;
            ((plVar25 = (long *)(lVar18 + (long)plVar23), pBVar21 < (BYTE *)((long)piVar14 + lVar18)
             && (src < plVar25)) &&
            (*(char *)((long)plVar23 + lVar18 + -1) == *(char *)((long)piVar14 + lVar18 + -1)));
            lVar18 = lVar18 + -1) {
        }
        sVar10 = sVar10 - lVar18;
        ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,uVar9 + 2,sVar10 + 1);
        uVar22 = (ulong)uVar19;
        uVar19 = uVar9;
LAB_00372fee:
        src = (void *)(sVar10 + 4 + (long)plVar25);
        plVar23 = (long *)src;
      } while (plVar17 < src);
      pUVar5[(ulong)(*(long *)(pBVar6 + (uVar16 & 0xffffffff) + 2) * -0x30e4432340650000) >>
             (bVar11 & 0x3f)] = UVar15 + 2;
      pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar11 & 0x3f)] =
           ((int)src + -2) - iVar24;
      uVar13 = (ulong)uVar19;
      for (; uVar16 = uVar13, uVar19 = (uint)uVar16, plVar23 = (long *)src, src <= plVar17;
          src = (void *)((long)src + sVar10 + 4)) {
        if (((int)uVar22 == 0) || ((int)*src != *(int *)((long)src - uVar22))) break;
        sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar22)),pInLimit);
        pUVar5[(ulong)(*src * -0x30e4432340650000) >> (bVar11 & 0x3f)] = (int)src - iVar24;
        ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
        uVar13 = uVar22;
        uVar22 = uVar16;
      }
    } while( true );
  }
  if (uVar9 != 7) {
    bVar11 = 0x20 - cVar7;
    do {
      do {
        uVar9 = (uint)uVar22;
        while( true ) {
          if (plVar17 <= plVar23) goto LAB_00373596;
          uVar12 = (uint)((int)*plVar23 * -0x61c8864f) >> (bVar11 & 0x1f);
          uVar13 = (long)plVar23 - (long)pBVar6;
          uVar4 = pUVar5[uVar12];
          UVar15 = (U32)uVar13;
          pUVar5[uVar12] = UVar15;
          if ((uVar19 != 0) &&
             (*(int *)((long)plVar23 + -(ulong)uVar19 + 1) == *(int *)((long)plVar23 + 1))) {
            plVar25 = (long *)((long)plVar23 + 1);
            sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 5),
                                (BYTE *)((long)plVar23 + -(ulong)uVar19 + 5),pInLimit);
            ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,0,sVar10 + 1);
            goto LAB_0037348b;
          }
          if ((uVar1 < uVar4) && (piVar14 = (int *)(pBVar6 + uVar4), *piVar14 == (int)*plVar23))
          break;
          plVar23 = (long *)((long)plVar23 + ((long)plVar23 - (long)src >> 8) + (ulong)uVar8);
        }
        uVar9 = (int)plVar23 - (int)piVar14;
        sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 4),(BYTE *)(piVar14 + 1),pInLimit);
        for (lVar18 = 0;
            ((plVar25 = (long *)(lVar18 + (long)plVar23), pBVar21 < (BYTE *)((long)piVar14 + lVar18)
             && (src < plVar25)) &&
            (*(char *)((long)plVar23 + lVar18 + -1) == *(char *)((long)piVar14 + lVar18 + -1)));
            lVar18 = lVar18 + -1) {
        }
        sVar10 = sVar10 - lVar18;
        ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,uVar9 + 2,sVar10 + 1);
        uVar22 = (ulong)uVar19;
        uVar19 = uVar9;
LAB_0037348b:
        src = (void *)(sVar10 + 4 + (long)plVar25);
        plVar23 = (long *)src;
      } while (plVar17 < src);
      pUVar5[(uint)(*(int *)(pBVar6 + (uVar13 & 0xffffffff) + 2) * -0x61c8864f) >> (bVar11 & 0x1f)]
           = UVar15 + 2;
      pUVar5[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar11 & 0x1f)] =
           ((int)src + -2) - iVar24;
      uVar13 = (ulong)uVar19;
      while( true ) {
        uVar16 = uVar13;
        uVar19 = (uint)uVar16;
        plVar23 = (long *)src;
        if (plVar17 < src) break;
        lVar18 = *src;
        if (((int)uVar22 == 0) || ((int)lVar18 != *(int *)((long)src - uVar22))) break;
        sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar22)),pInLimit);
        pUVar5[(uint)((int)lVar18 * -0x61c8864f) >> (bVar11 & 0x1f)] = (int)src - iVar24;
        ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
        src = (void *)((long)src + sVar10 + 4);
        uVar13 = uVar22;
        uVar22 = uVar16;
      }
    } while( true );
  }
  bVar11 = 0x40 - cVar7;
LAB_00372c60:
  uVar9 = (uint)uVar22;
  do {
    if (plVar17 <= plVar23) {
LAB_00373596:
      uVar8 = 0;
      if (uVar20 < uVar2) {
        uVar8 = uVar2;
      }
      if (uVar20 < uVar3) {
        uVar8 = uVar3;
      }
      if (uVar19 == 0) {
        uVar19 = uVar8;
      }
      if (uVar9 != 0) {
        uVar8 = uVar9;
      }
      *rep = uVar19;
      rep[1] = uVar8;
      return (long)pInLimit - (long)src;
    }
    uVar13 = (ulong)(*plVar23 * -0x30e44323405a9d00) >> (bVar11 & 0x3f);
    uVar16 = (long)plVar23 - (long)pBVar6;
    uVar4 = pUVar5[uVar13];
    UVar15 = (U32)uVar16;
    pUVar5[uVar13] = UVar15;
    if ((uVar19 != 0) &&
       (*(int *)((long)plVar23 + -(ulong)uVar19 + 1) == *(int *)((long)plVar23 + 1))) {
      plVar25 = (long *)((long)plVar23 + 1);
      sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 5),(BYTE *)((long)plVar23 + -(ulong)uVar19 + 5),
                          pInLimit);
      ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,0,sVar10 + 1);
      goto LAB_00372d91;
    }
    if ((uVar1 < uVar4) && (piVar14 = (int *)(pBVar6 + uVar4), *piVar14 == (int)*plVar23)) break;
    plVar23 = (long *)((long)plVar23 + ((long)plVar23 - (long)src >> 8) + (ulong)uVar8);
  } while( true );
  uVar9 = (int)plVar23 - (int)piVar14;
  sVar10 = ZSTD_count((BYTE *)((long)plVar23 + 4),(BYTE *)(piVar14 + 1),pInLimit);
  for (lVar18 = 0;
      ((plVar25 = (long *)(lVar18 + (long)plVar23), pBVar21 < (BYTE *)((long)piVar14 + lVar18) &&
       (src < plVar25)) &&
      (*(char *)((long)plVar23 + lVar18 + -1) == *(char *)((long)piVar14 + lVar18 + -1)));
      lVar18 = lVar18 + -1) {
  }
  sVar10 = sVar10 - lVar18;
  ZSTD_storeSeq(seqStore,(long)plVar25 - (long)src,src,uVar9 + 2,sVar10 + 1);
  uVar22 = (ulong)uVar19;
  uVar19 = uVar9;
LAB_00372d91:
  src = (void *)(sVar10 + 4 + (long)plVar25);
  plVar23 = (long *)src;
  if (src <= plVar17) {
    pUVar5[(ulong)(*(long *)(pBVar6 + (uVar16 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
           (bVar11 & 0x3f)] = UVar15 + 2;
    pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar11 & 0x3f)] =
         ((int)src + -2) - iVar24;
    uVar13 = (ulong)uVar19;
    for (; uVar16 = uVar13, uVar19 = (uint)uVar16, plVar23 = (long *)src, src <= plVar17;
        src = (void *)((long)src + sVar10 + 4)) {
      if (((int)uVar22 == 0) || ((int)*src != *(int *)((long)src - uVar22))) break;
      sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar22)),pInLimit);
      pUVar5[(ulong)(*src * -0x30e44323405a9d00) >> (bVar11 & 0x3f)] = (int)src - iVar24;
      ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
      uVar13 = uVar22;
      uVar22 = uVar16;
    }
  }
  goto LAB_00372c60;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}